

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode.cpp
# Opt level: O3

bool equal<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>,std::__cxx11::u16string>
               (unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
                *r1,basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                    *r2)

{
  char16_t *pcVar1;
  size_type sVar2;
  bool bVar3;
  long lVar4;
  char16_t *pcVar5;
  iterator local_98;
  iterator local_70;
  iterator local_50;
  
  tcb::unicode::detail::
  unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
  ::iterator::iterator
            (&local_50,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(r1->first_)._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(r1->last_)._M_current);
  local_70.first_._M_current = (r1->last_)._M_current;
  pcVar1 = (r2->_M_dataplus)._M_p;
  sVar2 = r2->_M_string_length;
  local_98.last_._M_current = local_50.last_._M_current;
  local_98.idx_ = local_50.idx_;
  local_98._25_7_ = local_50._25_7_;
  local_98.next_chars_ = local_50.next_chars_;
  local_98.first_._M_current = local_50.first_._M_current;
  local_70.next_chars_.chars_._M_elems[0] = L'\0';
  local_70.next_chars_.chars_._M_elems[1] = L'\0';
  local_70.next_chars_.size_ = 0;
  local_70.idx_ = '\0';
  local_70.last_._M_current = local_70.first_._M_current;
  bVar3 = tcb::unicode::detail::
          unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
          ::iterator::operator==(&local_98,&local_70);
  pcVar5 = pcVar1;
  if (sVar2 != 0 && !bVar3) {
    lVar4 = sVar2 * 2;
    do {
      lVar4 = lVar4 + -2;
      if (local_98.next_chars_.chars_._M_elems[local_98._24_8_ & 0xff] != *pcVar5) {
        return false;
      }
      tcb::unicode::detail::
      unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
      ::iterator::operator++(&local_98);
      pcVar5 = pcVar5 + 1;
      bVar3 = tcb::unicode::detail::
              unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
              ::iterator::operator==(&local_98,&local_70);
    } while ((!bVar3) && (lVar4 != 0));
  }
  bVar3 = tcb::unicode::detail::
          unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
          ::iterator::operator==(&local_98,&local_70);
  return pcVar5 == pcVar1 + sVar2 && bVar3;
}

Assistant:

bool equal(const R1& r1, const R2& r2)
{
    return std::equal(std::cbegin(r1), std::cend(r1),
                      std::cbegin(r2), std::cend(r2));
}